

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_bsr_8(m68k_info *info)

{
  build_relative_branch(info,0x1c,1,(int)(char)info->ir & 0xffffff00U | info->ir & 0xff);
  return;
}

Assistant:

static void d68000_bsr_8(m68k_info *info)
{
	build_relative_branch(info, M68K_INS_BSR, 1, make_int_8(info->ir));
}